

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

size_t count_deformers(aiScene *scene)

{
  ulong uVar1;
  size_t n;
  size_t i;
  size_t count;
  aiScene *scene_local;
  
  i = 0;
  for (n = 0; n < scene->mNumMeshes; n = n + 1) {
    uVar1 = (ulong)scene->mMeshes[n]->mNumBones;
    if (uVar1 != 0) {
      i = uVar1 + 1 + i;
    }
  }
  return i;
}

Assistant:

size_t count_deformers(const aiScene* scene) {
    size_t count = 0;
    for (size_t i = 0; i < scene->mNumMeshes; ++i) {
        const size_t n = scene->mMeshes[i]->mNumBones;
        if (n) {
            // 1 main deformer, 1 subdeformer per bone
            count += n + 1;
        }
    }
    return count;
}